

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclLib.cpp
# Opt level: O1

String __thiscall xmrig::OclLib::getString(OclLib *this,cl_device_id id,cl_device_info param)

{
  cl_int cVar1;
  char *__s;
  size_t sVar2;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar3;
  String SVar4;
  size_t size;
  size_t local_30;
  
  local_30 = 0;
  cVar1 = getDeviceInfo(id,param,0,(void *)0x0,&local_30);
  sVar3 = local_30;
  if (cVar1 == 0) {
    __s = (char *)operator_new__(local_30);
    memset(__s,0,sVar3);
    getDeviceInfo(id,param,sVar3,__s,(size_t *)0x0);
    *(char **)this = __s;
    sVar2 = strlen(__s);
    *(size_t *)(this + 8) = sVar2;
    sVar3 = extraout_RDX_00;
  }
  else {
    *(undefined8 *)this = 0;
    *(undefined8 *)(this + 8) = 0;
    sVar3 = extraout_RDX;
  }
  SVar4.m_size = sVar3;
  SVar4.m_data = (char *)this;
  return SVar4;
}

Assistant:

xmrig::String xmrig::OclLib::getString(cl_device_id id, cl_device_info param) noexcept
{
    return getOclString(OclLib::getDeviceInfo, id, param);
}